

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

bool __thiscall RenX_CommandsPlugin::initialize(RenX_CommandsPlugin *this)

{
  undefined1 *this_00;
  string *__lhs;
  duration<long,_std::ratio<1L,_1L>_> dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> dVar4;
  string_view in_key;
  string_view in_key_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [32];
  basic_string_view<char,_std::char_traits<char>_> local_60;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = &this->field_0x38;
  auVar2 = Jupiter::Config::get(this_00,0xf,"DefaultTBanTime",2,"1d");
  auVar3 = Jupiter::Config::get(this_00,0xb,"MaxTBanTime",2,"1w");
  dVar4 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                    (auVar2._8_8_,auVar2._8_8_ + auVar2._0_8_);
  (this->m_defaultTempBanTime).__r = dVar4.duration.__r.__r;
  dVar4 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                    (auVar3._8_8_,auVar3._8_8_ + auVar3._0_8_);
  dVar1.__r = (this->m_defaultTempBanTime).__r;
  if (dVar1.__r < dVar4.duration.__r.__r) {
    dVar1.__r = dVar4.duration.__r.__r;
  }
  (this->m_maxTempBanTime).__r = dVar1.__r;
  local_e0._0_16_ =
       Jupiter::Config::get
                 (this_00,0x10,"PlayerInfoFormat",0xc4,
                  "\x0303[Player Info]\x03{TCOLOR} \x02{RNAME}\x02 - ID: {ID} - Team: \x02{TEAML}\x02 - Vehicle Kills: {VEHICLEKILLS} - Building Kills {BUILDINGKILLS} - Kills {KILLS} - Deaths: {DEATHS} - KDR: {KDR} - Access: {ACCESS}"
                 );
  __lhs = &this->m_playerInfoFormat;
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)__lhs,(basic_string_view<char,_std::char_traits<char>_> *)&local_e0);
  std::operator+(&local_a0,__lhs,
                 " - IP: \x02{IP}\x02 - HWID: \x02{HWID}\x02 - RDNS: \x02{RDNS}\x02 - Steam ID: \x02{STEAM}"
                );
  in_key._M_str = "AdminPlayerInfoFormat";
  in_key._M_len = 0x15;
  Jupiter::Config::get<std::__cxx11::string>(&local_e0,(Config *)this_00,in_key,&local_a0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_adminPlayerInfoFormat,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_40._M_allocated_capacity = 1;
  local_40._8_8_ =
       (long)
       "\x0312[%.*s Request] \x03\x02%.*s\x02\x0307 has requested assistance in-game! Reason: %.*s\x03"
       + 0x4b;
  local_50._0_8_ = (pointer)0x1;
  local_50._8_8_ = "\x03";
  local_60._M_len = 3;
  local_60._M_str = " - ";
  local_80._16_8_ = 3;
  local_80._24_8_ = "\x0307";
  local_80._0_8_ = (pointer)0x1;
  local_80._8_8_ = "%";
  jessilib::
  join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>>
            (&local_c0,(jessilib *)(local_50 + 0x10),
             (basic_string_view<char,_std::char_traits<char>_> *)(RenX::tags + 0x2568),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (RenX::tags + 0x2408),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,&local_60
             ,(basic_string_view<char,_std::char_traits<char>_> *)(local_80 + 0x10),
             (basic_string_view<char,_std::char_traits<char>_> *)(RenX::tags + 0x2488),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
             (basic_string_view<char,_std::char_traits<char>_> *)0x3);
  in_key_00._M_str = "BuildingInfoFormat";
  in_key_00._M_len = 0x12;
  Jupiter::Config::get<std::__cxx11::string>(&local_e0,(Config *)this_00,in_key_00,&local_c0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_buildingInfoFormat,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  auVar2 = Jupiter::Config::get(this_00,10,"StaffTitle",9,"Moderator");
  local_e0._0_16_ = auVar2;
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->m_staffTitle,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_e0);
  RenX::sanitizeTags((string *)__lhs);
  RenX::sanitizeTags((string *)&this->m_adminPlayerInfoFormat);
  RenX::sanitizeTags((string *)&this->m_buildingInfoFormat);
  return true;
}

Assistant:

bool RenX_CommandsPlugin::initialize() {
	auto default_tban_time = this->config.get("DefaultTBanTime"sv, "1d"sv);
	auto max_tban_time = this->config.get("MaxTBanTime"sv, "1w"sv);
	m_defaultTempBanTime = jessilib::duration_from_string(default_tban_time.data(), default_tban_time.data() + default_tban_time.size()).duration;
	m_maxTempBanTime = std::max(jessilib::duration_from_string(max_tban_time.data(), max_tban_time.data() + max_tban_time.size()).duration, m_defaultTempBanTime);
	m_playerInfoFormat = this->config.get("PlayerInfoFormat"sv, IRCCOLOR "03[Player Info]" IRCCOLOR "{TCOLOR} " IRCBOLD "{RNAME}" IRCBOLD " - ID: {ID} - Team: " IRCBOLD "{TEAML}" IRCBOLD " - Vehicle Kills: {VEHICLEKILLS} - Building Kills {BUILDINGKILLS} - Kills {KILLS} - Deaths: {DEATHS} - KDR: {KDR} - Access: {ACCESS}"sv);
	m_adminPlayerInfoFormat = this->config.get("AdminPlayerInfoFormat"sv, m_playerInfoFormat + " - IP: " IRCBOLD "{IP}" IRCBOLD " - HWID: " IRCBOLD "{HWID}" IRCBOLD " - RDNS: " IRCBOLD "{RDNS}" IRCBOLD " - Steam ID: " IRCBOLD "{STEAM}");
	m_buildingInfoFormat = this->config.get("BuildingInfoFormat"sv, jessilib::join<std::string>(""sv IRCCOLOR, RenX::tags->buildingTeamColorTag, RenX::tags->buildingNameTag, ""sv IRCCOLOR, " - "sv, IRCCOLOR "07"sv, RenX::tags->buildingHealthPercentageTag, "%"sv));
	m_staffTitle = this->config.get("StaffTitle"sv, "Moderator"sv);

	RenX::sanitizeTags(m_playerInfoFormat);
	RenX::sanitizeTags(m_adminPlayerInfoFormat);
	RenX::sanitizeTags(m_buildingInfoFormat);
	return true;
}